

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.hpp
# Opt level: O0

Node<int> * __thiscall Node<int>::createNewNext(Node<int> *this)

{
  Node<int> *pNVar1;
  long in_RDI;
  Node<int> *node;
  undefined1 in_stack_ffffffffffffffef;
  Node<int> *in_stack_fffffffffffffff0;
  
  pNVar1 = (Node<int> *)operator_new(0x40);
  Node(in_stack_fffffffffffffff0,(bool)in_stack_ffffffffffffffef);
  pNVar1->next = *(Node<int> **)(in_RDI + 0x38);
  *(Node<int> **)(in_RDI + 0x38) = pNVar1;
  return pNVar1;
}

Assistant:

Node<T> *createNewNext() {
        Node *node = new Node<T>(false);
        node->next = next;
        next = node;

        return node;
    }